

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O1

_Bool parse_attributes(char **begin,char *end,element_t *element,plutosvg_document_t *document)

{
  byte bVar1;
  heap_t *heap;
  hashmap_entry_t *phVar2;
  size_t sVar3;
  hashmap_entry_t **pphVar4;
  size_t __nmemb;
  long lVar5;
  long lVar6;
  int iVar7;
  char *pcVar8;
  hashmap_t *phVar9;
  hashmap_entry_t **pphVar10;
  long lVar11;
  ulong uVar12;
  hashmap_entry *phVar13;
  byte *pbVar14;
  byte *pbVar15;
  attribute *paVar16;
  size_t sVar17;
  char *it_3;
  ulong uVar18;
  byte *pbVar19;
  ulong uVar20;
  hashmap_entry **pphVar21;
  char *it_8;
  char *it;
  byte *pbVar22;
  byte *pbVar23;
  byte *pbVar24;
  int iVar25;
  ulong uVar26;
  bool bVar27;
  
  pbVar24 = (byte *)*begin;
  do {
    do {
      if ((end <= pbVar24) ||
         (((bVar1 = *pbVar24, 0x19 < (byte)((bVar1 & 0xdf) + 0xbf) && (bVar1 != 0x5f)) &&
          (bVar1 != 0x3a)))) {
        *begin = (char *)pbVar24;
        return true;
      }
      pbVar22 = pbVar24 + 1;
      bVar27 = pbVar22 < end;
      pbVar23 = pbVar22;
      if (bVar27) {
        pcVar8 = end + (-1 - (long)pbVar24);
        do {
          bVar1 = *pbVar22;
          if (((0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) && (bVar1 != 0x3a)) &&
             ((bVar1 != 0x5f &&
              (pbVar23 = pbVar22, 9 < (byte)(bVar1 - 0x30) && 1 < (byte)(bVar1 - 0x2d))))) break;
          pbVar22 = pbVar22 + 1;
          bVar27 = pbVar22 < end;
          pcVar8 = pcVar8 + -1;
          pbVar23 = (byte *)end;
        } while (pcVar8 != (char *)0x0);
      }
      iVar7 = lookupid((char *)pbVar24,(long)pbVar23 - (long)pbVar24,
                       (name_entry_t *)attributeid_table,0x300);
      pbVar24 = pbVar23;
      if (bVar27) {
        do {
          pbVar24 = pbVar23;
          if ((0x20 < (ulong)*pbVar23) || ((0x100002600U >> ((ulong)*pbVar23 & 0x3f) & 1) == 0))
          break;
          pbVar23 = pbVar23 + 1;
          pbVar24 = (byte *)end;
        } while (pbVar23 != (byte *)end);
      }
      if ((end <= pbVar24) || (*pbVar24 != 0x3d)) {
        return false;
      }
      pbVar24 = pbVar24 + 1;
      pbVar22 = pbVar24;
      if (pbVar24 < end) {
        do {
          pbVar22 = pbVar24;
          if ((0x20 < (ulong)*pbVar24) || ((0x100002600U >> ((ulong)*pbVar24 & 0x3f) & 1) == 0))
          break;
          pbVar24 = pbVar24 + 1;
          pbVar22 = (byte *)end;
        } while (pbVar24 != (byte *)end);
      }
      if (end <= pbVar22) {
        return false;
      }
      bVar1 = *pbVar22;
      if ((bVar1 != 0x27) && (bVar1 != 0x22)) {
        return false;
      }
      pbVar22 = pbVar22 + 1;
      pbVar24 = pbVar22;
      if (pbVar22 < end) {
        do {
          pbVar24 = pbVar22;
          if ((0x20 < (ulong)*pbVar22) || ((0x100002600U >> ((ulong)*pbVar22 & 0x3f) & 1) == 0))
          break;
          pbVar22 = pbVar22 + 1;
          pbVar24 = (byte *)end;
        } while (pbVar22 != (byte *)end);
      }
      bVar27 = pbVar24 < end;
      if (!bVar27) {
        return false;
      }
      pbVar22 = pbVar24;
      if (*pbVar24 != bVar1) {
        pcVar8 = end + (-1 - (long)pbVar24);
        do {
          if (pcVar8 == (char *)0x0) {
            return false;
          }
          pbVar22 = pbVar22 + 1;
          pcVar8 = pcVar8 + -1;
        } while (*pbVar22 != bVar1);
        bVar27 = pbVar22 < end;
      }
      if (!bVar27) {
        return false;
      }
      pbVar23 = pbVar22;
      pbVar19 = pbVar22;
      if (*pbVar22 != bVar1) {
        return false;
      }
      while (((pbVar24 < pbVar23 && (pbVar19 = pbVar23, (ulong)pbVar23[-1] < 0x21)) &&
             ((0x100002600U >> ((ulong)pbVar23[-1] & 0x3f) & 1) != 0))) {
        pbVar23 = pbVar23 + -1;
        pbVar19 = pbVar24;
      }
      if ((element != (element_t *)0x0) && (iVar7 != 0)) {
        iVar25 = (int)((long)pbVar19 - (long)pbVar24);
        if (iVar7 == 0x25) {
          if (0 < iVar25) {
            pbVar23 = pbVar24 + iVar25;
            while ((bVar1 = *pbVar24, pbVar19 = pbVar24, (byte)(bVar1 + 0x9f) < 0x1a ||
                   (bVar1 == 0x5f || (byte)(bVar1 + 0xbf) < 0x1a))) {
              do {
                pbVar19 = pbVar19 + 1;
                if (pbVar23 <= pbVar19) break;
                bVar1 = *pbVar19;
              } while ((((byte)(bVar1 + 0x9f) < 0x1a) ||
                       (bVar1 == 0x5f || (byte)(bVar1 + 0xbf) < 0x1a)) ||
                      (bVar1 == 0x2d || (byte)(bVar1 - 0x30) < 10));
              iVar7 = lookupid((char *)pbVar24,(long)pbVar19 - (long)pbVar24,
                               (name_entry_t *)cssattributeid_table,0x130);
              pbVar24 = pbVar19;
              if (pbVar23 > pbVar19) {
                do {
                  pbVar24 = pbVar19;
                  if ((0x20 < (ulong)*pbVar19) ||
                     ((0x100002600U >> ((ulong)*pbVar19 & 0x3f) & 1) == 0)) break;
                  pbVar19 = pbVar19 + 1;
                  pbVar24 = pbVar23;
                } while (pbVar19 != pbVar23);
              }
              if ((pbVar23 <= pbVar24) || (*pbVar24 != 0x3a)) break;
              pbVar24 = pbVar24 + 1;
              pbVar19 = pbVar24;
              if (pbVar24 < pbVar23) {
                do {
                  pbVar19 = pbVar24;
                  if ((0x20 < (ulong)*pbVar24) ||
                     ((0x100002600U >> ((ulong)*pbVar24 & 0x3f) & 1) == 0)) break;
                  pbVar24 = pbVar24 + 1;
                  pbVar19 = pbVar23;
                } while (pbVar24 != pbVar23);
              }
              bVar27 = pbVar19 < pbVar23;
              pbVar14 = pbVar19;
              pbVar15 = pbVar19;
              pbVar24 = pbVar19;
              if (bVar27) {
                bVar1 = *pbVar19;
                while (pbVar15 = pbVar14, pbVar24 = pbVar14, bVar1 != 0x3b) {
                  pbVar14 = pbVar14 + 1;
                  bVar27 = pbVar14 < pbVar23;
                  pbVar15 = pbVar14;
                  pbVar24 = pbVar14;
                  if (!bVar27) break;
                  bVar1 = *pbVar14;
                }
              }
              while (((pbVar19 < pbVar14 && (pbVar15 = pbVar14, (ulong)pbVar14[-1] < 0x21)) &&
                     ((0x100002600U >> ((ulong)pbVar14[-1] & 0x3f) & 1) != 0))) {
                pbVar14 = pbVar14 + -1;
                pbVar15 = pbVar19;
              }
              if (iVar7 != 0) {
                paVar16 = (attribute *)heap_alloc(document->heap,0x20);
                paVar16->id = iVar7;
                (paVar16->value).data = (char *)pbVar19;
                (paVar16->value).length = (long)((int)pbVar15 - (int)pbVar19);
                paVar16->next = element->attributes;
                element->attributes = paVar16;
              }
              pbVar19 = pbVar24;
              if (bVar27) {
                if (((ulong)*pbVar24 < 0x3c) &&
                   ((0x800000100002600U >> ((ulong)*pbVar24 & 0x3f) & 1) != 0)) {
                  bVar27 = true;
                  do {
                    pbVar19 = pbVar24;
                    if ((0x20 < (ulong)*pbVar24) ||
                       ((0x100002600U >> ((ulong)*pbVar24 & 0x3f) & 1) == 0)) break;
                    pbVar24 = pbVar24 + 1;
                    bVar27 = pbVar24 < pbVar23;
                    pbVar19 = pbVar23;
                  } while (pbVar24 != pbVar23);
                  goto LAB_00104938;
                }
              }
              else {
LAB_00104938:
                pbVar24 = pbVar19;
                if (bVar27) {
                  bVar27 = false;
                  if (pbVar19 < pbVar23) {
                    bVar27 = *pbVar19 == 0x3b;
                    pbVar19 = pbVar19 + bVar27;
                  }
                  pbVar24 = pbVar19;
                  if ((bVar27) && (pbVar19 < pbVar23)) {
                    while (pbVar24 = pbVar19, (ulong)*pbVar19 < 0x21) {
                      if (((0x100002600U >> ((ulong)*pbVar19 & 0x3f) & 1) == 0) ||
                         (pbVar19 = pbVar19 + 1, pbVar24 = pbVar23, pbVar19 == pbVar23)) break;
                    }
                  }
                }
              }
              if (pbVar23 <= pbVar24) break;
            }
          }
        }
        else if (iVar7 == 0x12) {
          if (document->id_cache == (hashmap_t *)0x0) {
            phVar9 = (hashmap_t *)malloc(0x18);
            pphVar10 = (hashmap_entry_t **)calloc(0x10,8);
            phVar9->buckets = pphVar10;
            phVar9->size = 0;
            phVar9->capacity = 0x10;
            document->id_cache = phVar9;
          }
          heap = document->heap;
          phVar9 = document->id_cache;
          lVar11 = (long)pbVar19 - (long)pbVar24 << 0x20;
          uVar26 = (ulong)iVar25;
          uVar18 = uVar26;
          if (lVar11 != 0) {
            uVar12 = 0;
            do {
              uVar18 = (long)(char)pbVar24[uVar12] + uVar18 * 0x1f;
              uVar12 = uVar12 + 1;
            } while (uVar26 != uVar12);
          }
          pphVar21 = phVar9->buckets + (phVar9->capacity - 1 & uVar18);
          do {
            phVar2 = *pphVar21;
            if (phVar2 == (hashmap_entry_t *)0x0) {
              phVar13 = (hashmap_entry *)heap_alloc(heap,0x28);
              (phVar13->name).data = (char *)pbVar24;
              (phVar13->name).length = uVar26;
              phVar13->hash = uVar18;
              phVar13->value = element;
              phVar13->next = (hashmap_entry *)0x0;
              *pphVar21 = phVar13;
              sVar3 = phVar9->capacity;
              uVar12 = phVar9->size + 1;
              phVar9->size = uVar12;
              if (sVar3 * 3 >> 2 < uVar12) {
                __nmemb = sVar3 * 2;
                pphVar10 = (hashmap_entry_t **)calloc(__nmemb,8);
                if (sVar3 != 0) {
                  pphVar4 = phVar9->buckets;
                  sVar17 = 0;
                  do {
                    phVar2 = pphVar4[sVar17];
                    while (phVar2 != (hashmap_entry_t *)0x0) {
                      phVar13 = phVar2->next;
                      uVar12 = phVar2->hash & __nmemb - 1;
                      phVar2->next = pphVar10[uVar12];
                      pphVar10[uVar12] = phVar2;
                      phVar2 = phVar13;
                    }
                    sVar17 = sVar17 + 1;
                  } while (sVar17 != sVar3);
                }
                free(phVar9->buckets);
                phVar9->buckets = pphVar10;
                phVar9->capacity = __nmemb;
              }
              bVar27 = false;
            }
            else {
              if (phVar2->hash == uVar18) {
                sVar3 = (phVar2->name).length;
                bVar27 = sVar3 == uVar26 && lVar11 == 0;
                if ((lVar11 != 0) && (sVar3 == uVar26)) {
                  pbVar23 = (byte *)(phVar2->name).data;
                  if (*pbVar24 != *pbVar23) goto LAB_00104749;
                  uVar12 = 0;
                  do {
                    uVar20 = uVar26;
                    if (uVar26 - 1 == uVar12) break;
                    lVar5 = uVar12 + 1;
                    uVar20 = uVar12 + 1;
                    lVar6 = uVar12 + 1;
                    uVar12 = uVar20;
                  } while (pbVar24[lVar5] == pbVar23[lVar6]);
                  bVar27 = uVar26 <= uVar20;
                }
                if (bVar27) {
                  phVar2->value = element;
                  bVar27 = false;
                  goto LAB_00104752;
                }
              }
LAB_00104749:
              pphVar21 = &phVar2->next;
              bVar27 = true;
            }
LAB_00104752:
          } while (bVar27);
        }
        else {
          paVar16 = (attribute *)heap_alloc(document->heap,0x20);
          paVar16->id = iVar7;
          (paVar16->value).data = (char *)pbVar24;
          (paVar16->value).length = (long)iVar25;
          paVar16->next = element->attributes;
          element->attributes = paVar16;
        }
      }
      pbVar22 = pbVar22 + 1;
      pbVar24 = pbVar22;
    } while (end <= pbVar22);
    do {
      pbVar24 = pbVar22;
      if ((0x20 < (ulong)*pbVar22) || ((0x100002600U >> ((ulong)*pbVar22 & 0x3f) & 1) == 0)) break;
      pbVar22 = pbVar22 + 1;
      pbVar24 = (byte *)end;
    } while (pbVar22 != (byte *)end);
  } while( true );
}

Assistant:

static bool parse_attributes(const char** begin, const char* end, element_t* element, plutosvg_document_t* document)
{
    const char* it = *begin;
    while(it < end && IS_STARTNAMECHAR(*it)) {
        const char* data = it++;
        while(it < end && IS_NAMECHAR(*it))
            ++it;
        int id = attributeid(data, it - data);
        skip_ws(&it, end);
        if(it >= end || *it != '=')
            return false;
        ++it;
        skip_ws(&it, end);
        if(it >= end || (*it != '"' && *it != '\''))
            return false;
        const char quote = *it++;
        skip_ws(&it, end);
        data = it;
        while(it < end && *it != quote)
            ++it;
        if(it >= end || *it != quote)
            return false;
        int length = rtrim(data, it) - data;
        if(id && element) {
            if(id == ATTR_ID) {
                if(document->id_cache == NULL)
                    document->id_cache = hashmap_create();
                hashmap_put(document->id_cache, document->heap, data, length, element);
            } else if(id == ATTR_STYLE) {
                parse_style(data, length, element, document);
            } else {
                add_attribute(element, document, id, data, length);
            }
        }

        ++it;
        skip_ws(&it, end);
    }

    *begin = it;
    return true;
}